

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_point_query_base.h
# Opt level: O2

bool __thiscall
S2ClosestPointQueryBase<S2MinDistance,_int>::ProcessOrEnqueue
          (S2ClosestPointQueryBase<S2MinDistance,_int> *this,S2CellId id,Iterator *iter,bool seek)

{
  S2Region *pSVar1;
  int iVar2;
  S2CellId SVar3;
  PointData *pPVar4;
  undefined7 in_register_00000009;
  long lVar5;
  int i;
  long lVar6;
  S1ChordAngle a;
  S2MinDistance distance;
  S2Cell cell;
  value_type local_70;
  S2Cell local_60;
  
  if ((int)CONCAT71(in_register_00000009,seek) != 0) {
    S2PointIndex<int>::Iterator::Seek(iter,(S2CellId)(id.id_ - (~id.id_ & id.id_ - 1)));
  }
  if ((id.id_ & 1) == 0) {
    lVar5 = 0;
    while ((((iter->iter_).node != (iter->end_).node ||
            ((iter->iter_).position != (iter->end_).position)) &&
           (SVar3 = S2PointIndex<int>::Iterator::id(iter), SVar3.id_ <= (id.id_ - 1 | id.id_)))) {
      if (lVar5 == 0xc) {
        S2Cell::S2Cell(&local_60,id);
        a.length2_ = (this->distance_limit_).super_S1ChordAngle.length2_;
        iVar2 = (*this->target_->_vptr_S2DistanceTarget[5])(this->target_,&local_60);
        if (((char)iVar2 != '\0') &&
           ((pSVar1 = this->options_->region_, pSVar1 == (S2Region *)0x0 ||
            (iVar2 = (*pSVar1->_vptr_S2Region[7])(pSVar1,&local_60), (char)iVar2 != '\0')))) {
          if (this->use_conservative_cell_distance_ == true) {
            a = operator-(a,(this->options_->max_error_).length2_);
          }
          local_70.distance.super_S1ChordAngle.length2_ = (S1ChordAngle)(S1ChordAngle)a.length2_;
          local_70.id.id_ = id.id_;
          std::
          priority_queue<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>,_std::less<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
          ::push(&this->queue_,&local_70);
        }
        return true;
      }
      pPVar4 = S2PointIndex<int>::Iterator::point_data(iter);
      this->tmp_point_data_[lVar5] = pPVar4;
      lVar5 = lVar5 + 1;
      S2PointIndex<int>::Iterator::Next(iter);
    }
    for (lVar6 = 0; lVar5 != lVar6; lVar6 = lVar6 + 1) {
      MaybeAddResult(this,this->tmp_point_data_[lVar6]);
    }
  }
  else {
    while ((((iter->iter_).node != (iter->end_).node ||
            ((iter->iter_).position != (iter->end_).position)) &&
           (SVar3 = S2PointIndex<int>::Iterator::id(iter), SVar3.id_ == id.id_))) {
      pPVar4 = S2PointIndex<int>::Iterator::point_data(iter);
      MaybeAddResult(this,pPVar4);
      S2PointIndex<int>::Iterator::Next(iter);
    }
  }
  return false;
}

Assistant:

bool S2ClosestPointQueryBase<Distance, Data>::ProcessOrEnqueue(
    S2CellId id, Iterator* iter, bool seek) {
  if (seek) iter->Seek(id.range_min());
  if (id.is_leaf()) {
    // Leaf cells can't be subdivided.
    for (; !iter->done() && iter->id() == id; iter->Next()) {
      MaybeAddResult(&iter->point_data());
    }
    return false;  // No need to seek to next child.
  }
  S2CellId last = id.range_max();
  int num_points = 0;
  for (; !iter->done() && iter->id() <= last; iter->Next()) {
    if (num_points == kMinPointsToEnqueue - 1) {
      // This cell has too many points (including this one), so enqueue it.
      S2Cell cell(id);
      Distance distance = distance_limit_;
      // We check "region_" second because it may be relatively expensive.
      if (target_->UpdateMinDistance(cell, &distance) &&
          (!options().region() || options().region()->MayIntersect(cell))) {
        if (use_conservative_cell_distance_) {
          // Ensure that "distance" is a lower bound on distance to the cell.
          distance = distance - options().max_error();
        }
        queue_.push(QueueEntry(distance, id));
      }
      return true;  // Seek to next child.
    }
    tmp_point_data_[num_points++] = &iter->point_data();
  }
  // There were few enough points that we might as well process them now.
  for (int i = 0; i < num_points; ++i) {
    MaybeAddResult(tmp_point_data_[i]);
  }
  return false;  // No need to seek to next child.
}